

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void md5_update_uv_s16(com_md5_t *md5,void *buf_t,u32 len,int offset)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  u8 t [81960];
  
  uVar4 = md5->bits[0];
  uVar1 = len * 2;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 2) {
    t[uVar3] = *(u8 *)((long)buf_t + uVar3 + (uint)offset);
    t[uVar3 + 1] = '\0';
  }
  uVar2 = uVar4 >> 3 & 0x3f;
  md5->bits[0] = uVar4 + len * 0x10;
  md5->bits[1] = md5->bits[1] + (uVar1 >> 0x1d) + (uint)CARRY4(uVar4,len * 0x10);
  uVar4 = 0x40 - uVar2;
  if (uVar1 < uVar4) {
    uVar3 = (ulong)uVar2;
    uVar4 = 0;
  }
  else {
    memcpy(md5->msg + uVar2,t,(ulong)uVar4);
    com_md5_trans(md5->h,(u32 *)md5->msg);
    uVar3 = 0;
    for (; uVar4 + 0x3f < uVar1; uVar4 = uVar4 + 0x40) {
      com_md5_trans(md5->h,(u32 *)(t + uVar4));
    }
  }
  if (uVar1 != uVar4) {
    memcpy(md5->msg + uVar3,t + uVar4,(ulong)(uVar1 - uVar4));
  }
  return;
}

Assistant:

static void md5_update_uv_s16(com_md5_t *md5, void *buf_t, u32 len, int offset)
{
    u8 *buf;
    u32 i, idx, part_len, j;
    u8 t[8196 * 10];
    buf = (u8 *)buf_t + offset;
    idx = (u32)((md5->bits[0] >> 3) & 0x3f);
    len = len * 2;
    for (j = 0; j < len; j += 2) {
        t[j] = buf[j];
        t[j + 1] = 0;
    }
    md5->bits[0] += (len << 3);
    if (md5->bits[0] < (len << 3)) {
        (md5->bits[1])++;
    }
    md5->bits[1] += (len >> 29);
    part_len = 64 - idx;
    if (len >= part_len) {
        memcpy(md5->msg + idx, t, part_len);
        com_md5_trans(md5->h, (u32 *)md5->msg);
        for (i = part_len; i + 63 < len; i += 64) {
            com_md5_trans(md5->h, (u32 *)(t + i));
        }
        idx = 0;
    } else {
        i = 0;
    }
    if (len - i > 0) {
        memcpy(md5->msg + idx, t + i, len - i);
    }
}